

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::BlockRequested
          (PeerManagerImpl *this,NodeId nodeid,CBlockIndex *block,iterator **pit)

{
  optional<long> from_peer;
  bool bVar1;
  CNodeState *pCVar2;
  size_type sVar3;
  duration<long,_std::ratio<1L,_1000000L>_> dVar4;
  pointer ppVar5;
  undefined8 *in_RCX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CNodeState *state;
  uint256 *hash;
  __enable_if_t<is_constructible<value_type,_pair<uint256,_pair<long,__List_iterator<QueuedBlock>_>_>_>::value,_iterator>
  itInFlight;
  iterator it;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  range;
  pair<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>
  *in_stack_fffffffffffffe78;
  pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  *in_stack_fffffffffffffe90;
  const_iterator in_stack_fffffffffffffe98;
  CTxMemPool *in_stack_fffffffffffffea0;
  PartiallyDownloadedBlock *in_stack_fffffffffffffea8;
  uint256 *in_stack_fffffffffffffeb0;
  PeerManagerImpl *this_00;
  long lVar6;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = in_RDI;
  CBlockIndex::GetBlockHash
            ((CBlockIndex *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  this_00 = (PeerManagerImpl *)&stack0xffffffffffffffd8;
  pCVar2 = State((PeerManagerImpl *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (NodeId)in_stack_fffffffffffffe80);
  if (pCVar2 == (CNodeState *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x546,
                  "bool (anonymous namespace)::PeerManagerImpl::BlockRequested(NodeId, const CBlockIndex &, std::list<QueuedBlock>::iterator **)"
                 );
  }
  std::
  multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  ::count((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
          (key_type *)in_stack_fffffffffffffe80);
  inline_assertion_check<false,bool>
            ((bool *)in_stack_fffffffffffffe98._M_node,(char *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe8c,(char *)in_stack_fffffffffffffe80,
             (char *)in_stack_fffffffffffffe78);
  std::
  multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  ::equal_range((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                (key_type *)in_stack_fffffffffffffe80);
  do {
    bVar1 = std::operator==((_Self *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                            (_Self *)in_stack_fffffffffffffe80);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::optional<long>::optional<long_&,_true>
                ((optional<long> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 &in_stack_fffffffffffffe80->first);
      from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
      ._8_7_ = in_stack_ffffffffffffff28;
      from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
      ._M_payload._M_value = lVar6;
      from_peer.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
      ._15_1_ = in_stack_ffffffffffffff2f;
      RemoveBlockRequest(this_00,in_stack_fffffffffffffeb0,from_peer);
      std::__cxx11::
      list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
      ::end((list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
             *)in_stack_fffffffffffffe80);
      std::_List_const_iterator<(anonymous_namespace)::QueuedBlock>::_List_const_iterator
                ((_List_const_iterator<(anonymous_namespace)::QueuedBlock> *)
                 in_stack_fffffffffffffe78,(iterator *)0x2bd06e);
      if (in_RCX != (undefined8 *)0x0) {
        operator_new(0xa8);
        PartiallyDownloadedBlock::PartiallyDownloadedBlock
                  (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      }
      std::unique_ptr<PartiallyDownloadedBlock,std::default_delete<PartiallyDownloadedBlock>>::
      unique_ptr<std::default_delete<PartiallyDownloadedBlock>,void>
                ((unique_ptr<PartiallyDownloadedBlock,_std::default_delete<PartiallyDownloadedBlock>_>
                  *)in_stack_fffffffffffffe78,(pointer)0x2bd0f8);
      std::__cxx11::
      list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
      ::insert((list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe98,
               (value_type *)in_stack_fffffffffffffe78);
      QueuedBlock::~QueuedBlock((QueuedBlock *)in_stack_fffffffffffffe78);
      sVar3 = std::__cxx11::
              list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
              ::size((list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                      *)in_stack_fffffffffffffe78);
      if (sVar3 == 1) {
        dVar4 = GetTime<std::chrono::duration<long,std::ratio<1l,1000000l>>>();
        (pCVar2->m_downloading_since).__r = dVar4.__r;
        *(int *)(in_RDI + 0x458) = *(int *)(in_RDI + 0x458) + 1;
      }
      std::make_pair<long&,std::_List_iterator<(anonymous_namespace)::QueuedBlock>&>
                ((long *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (_List_iterator<(anonymous_namespace)::QueuedBlock> *)in_stack_fffffffffffffe80);
      std::
      make_pair<uint256_const&,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>
                ((uint256 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 in_stack_fffffffffffffe80);
      std::
      multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
      ::
      insert<std::pair<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>
                ((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                  *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      if (in_RCX != (undefined8 *)0x0) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                               *)in_stack_fffffffffffffe78);
        *in_RCX = &(ppVar5->second).second;
      }
      bVar1 = true;
LAB_002bd287:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return bVar1;
    }
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                           *)in_stack_fffffffffffffe78);
    if ((ppVar5->second).first == in_RSI) {
      if (in_RCX != (undefined8 *)0x0) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                               *)in_stack_fffffffffffffe78);
        *in_RCX = &(ppVar5->second).second;
      }
      bVar1 = false;
      goto LAB_002bd287;
    }
    std::
    _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
    ::operator++(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  } while( true );
}

Assistant:

bool PeerManagerImpl::BlockRequested(NodeId nodeid, const CBlockIndex& block, std::list<QueuedBlock>::iterator** pit)
{
    const uint256& hash{block.GetBlockHash()};

    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    Assume(mapBlocksInFlight.count(hash) <= MAX_CMPCTBLOCKS_INFLIGHT_PER_BLOCK);

    // Short-circuit most stuff in case it is from the same node
    for (auto range = mapBlocksInFlight.equal_range(hash); range.first != range.second; range.first++) {
        if (range.first->second.first == nodeid) {
            if (pit) {
                *pit = &range.first->second.second;
            }
            return false;
        }
    }

    // Make sure it's not being fetched already from same peer.
    RemoveBlockRequest(hash, nodeid);

    std::list<QueuedBlock>::iterator it = state->vBlocksInFlight.insert(state->vBlocksInFlight.end(),
            {&block, std::unique_ptr<PartiallyDownloadedBlock>(pit ? new PartiallyDownloadedBlock(&m_mempool) : nullptr)});
    if (state->vBlocksInFlight.size() == 1) {
        // We're starting a block download (batch) from this peer.
        state->m_downloading_since = GetTime<std::chrono::microseconds>();
        m_peers_downloading_from++;
    }
    auto itInFlight = mapBlocksInFlight.insert(std::make_pair(hash, std::make_pair(nodeid, it)));
    if (pit) {
        *pit = &itInFlight->second.second;
    }
    return true;
}